

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void FTransformWHT_SSE2(int16_t *in,int16_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 *in_RSI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i b2b3;
  __m128i tmp_b2b3;
  __m128i b3b2;
  __m128i b0b1;
  __m128i a1a2;
  __m128i a0a3;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  undefined8 local_2a8;
  undefined2 in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd82;
  undefined2 in_stack_fffffffffffffd84;
  undefined2 in_stack_fffffffffffffd86;
  int16_t *in_stack_fffffffffffffd88;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  
  FTransformWHTRow_SSE2
            (in_stack_fffffffffffffd88,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffd86,
                      CONCAT24(in_stack_fffffffffffffd84,
                               CONCAT22(in_stack_fffffffffffffd82,in_stack_fffffffffffffd80))));
  FTransformWHTRow_SSE2
            (in_stack_fffffffffffffd88,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffd86,
                      CONCAT24(in_stack_fffffffffffffd84,
                               CONCAT22(in_stack_fffffffffffffd82,in_stack_fffffffffffffd80))));
  FTransformWHTRow_SSE2
            (in_stack_fffffffffffffd88,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffd86,
                      CONCAT24(in_stack_fffffffffffffd84,
                               CONCAT22(in_stack_fffffffffffffd82,in_stack_fffffffffffffd80))));
  FTransformWHTRow_SSE2
            (in_stack_fffffffffffffd88,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffd86,
                      CONCAT24(in_stack_fffffffffffffd84,
                               CONCAT22(in_stack_fffffffffffffd82,in_stack_fffffffffffffd80))));
  local_f8 = (int)local_1e8;
  iStack_f4 = (int)((ulong)local_1e8 >> 0x20);
  iStack_f0 = (int)uStack_1e0;
  iStack_ec = (int)((ulong)uStack_1e0 >> 0x20);
  local_108 = (int)local_208;
  iStack_104 = (int)((ulong)local_208 >> 0x20);
  iStack_100 = (int)uStack_200;
  iStack_fc = (int)((ulong)uStack_200 >> 0x20);
  local_118 = (int)local_1f8;
  iStack_114 = (int)((ulong)local_1f8 >> 0x20);
  iStack_110 = (int)uStack_1f0;
  iStack_10c = (int)((ulong)uStack_1f0 >> 0x20);
  local_128 = (int)local_218;
  iStack_124 = (int)((ulong)local_218 >> 0x20);
  iStack_120 = (int)uStack_210;
  iStack_11c = (int)((ulong)uStack_210 >> 0x20);
  auVar4._4_4_ = iStack_f4 + iStack_104;
  auVar4._0_4_ = local_f8 + local_108;
  auVar4._12_4_ = iStack_ec + iStack_fc;
  auVar4._8_4_ = iStack_f0 + iStack_100;
  auVar3._4_4_ = iStack_f4 - iStack_104;
  auVar3._0_4_ = local_f8 - local_108;
  auVar3._12_4_ = iStack_ec - iStack_fc;
  auVar3._8_4_ = iStack_f0 - iStack_100;
  auVar5 = packssdw(auVar4,auVar3);
  auVar2._4_4_ = iStack_114 + iStack_124;
  auVar2._0_4_ = local_118 + local_128;
  auVar2._12_4_ = iStack_10c + iStack_11c;
  auVar2._8_4_ = iStack_110 + iStack_120;
  auVar1._4_4_ = iStack_114 - iStack_124;
  auVar1._0_4_ = local_118 - local_128;
  auVar1._12_4_ = iStack_10c - iStack_11c;
  auVar1._8_4_ = iStack_110 - iStack_120;
  auVar6 = packssdw(auVar2,auVar1);
  local_d8 = auVar5._0_2_;
  sStack_d6 = auVar5._2_2_;
  sStack_d4 = auVar5._4_2_;
  sStack_d2 = auVar5._6_2_;
  sStack_d0 = auVar5._8_2_;
  sStack_ce = auVar5._10_2_;
  sStack_cc = auVar5._12_2_;
  sStack_ca = auVar5._14_2_;
  local_e8 = auVar6._0_2_;
  sStack_e6 = auVar6._2_2_;
  sStack_e4 = auVar6._4_2_;
  sStack_e2 = auVar6._6_2_;
  sStack_e0 = auVar6._8_2_;
  sStack_de = auVar6._10_2_;
  sStack_dc = auVar6._12_2_;
  sStack_da = auVar6._14_2_;
  auVar5._10_2_ = sStack_d6 - sStack_e6;
  auVar5._8_2_ = local_d8 - local_e8;
  auVar5._12_2_ = sStack_d4 - sStack_e4;
  auVar5._14_2_ = sStack_d2 - sStack_e2;
  auVar6._2_2_ = sStack_d6 + sStack_e6;
  auVar6._0_2_ = local_d8 + local_e8;
  auVar6._4_2_ = sStack_d4 + sStack_e4;
  auVar6._6_2_ = sStack_d2 + sStack_e2;
  auVar6._10_2_ = sStack_ce + sStack_de;
  auVar6._8_2_ = sStack_d0 + sStack_e0;
  auVar6._12_2_ = sStack_cc + sStack_dc;
  auVar6._14_2_ = sStack_ca + sStack_da;
  auVar6 = psraw(auVar6,ZEXT416(1));
  local_148 = auVar6._0_8_;
  uStack_140 = auVar6._8_8_;
  *in_RSI = local_148;
  in_RSI[1] = uStack_140;
  auVar5._0_8_ = local_2a8;
  auVar5 = psraw(auVar5,ZEXT416(1));
  local_168 = auVar5._0_8_;
  uStack_160 = auVar5._8_8_;
  in_RSI[2] = local_168;
  in_RSI[3] = uStack_160;
  return;
}

Assistant:

static void FTransformWHT_SSE2(const int16_t* in, int16_t* out) {
  // Input is 12b signed.
  __m128i row0, row1, row2, row3;
  // Rows are 14b signed.
  FTransformWHTRow_SSE2(in + 0 * 64, &row0);
  FTransformWHTRow_SSE2(in + 1 * 64, &row1);
  FTransformWHTRow_SSE2(in + 2 * 64, &row2);
  FTransformWHTRow_SSE2(in + 3 * 64, &row3);

  {
    // The a* are 15b signed.
    const __m128i a0 = _mm_add_epi32(row0, row2);
    const __m128i a1 = _mm_add_epi32(row1, row3);
    const __m128i a2 = _mm_sub_epi32(row1, row3);
    const __m128i a3 = _mm_sub_epi32(row0, row2);
    const __m128i a0a3 = _mm_packs_epi32(a0, a3);
    const __m128i a1a2 = _mm_packs_epi32(a1, a2);

    // The b* are 16b signed.
    const __m128i b0b1 = _mm_add_epi16(a0a3, a1a2);
    const __m128i b3b2 = _mm_sub_epi16(a0a3, a1a2);
    const __m128i tmp_b2b3 = _mm_unpackhi_epi64(b3b2, b3b2);
    const __m128i b2b3 = _mm_unpacklo_epi64(tmp_b2b3, b3b2);

    _mm_storeu_si128((__m128i*)&out[0], _mm_srai_epi16(b0b1, 1));
    _mm_storeu_si128((__m128i*)&out[8], _mm_srai_epi16(b2b3, 1));
  }
}